

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDComponentBase * __thiscall ON_SubDComponentPtr::ComponentBase(ON_SubDComponentPtr *this)

{
  uint uVar1;
  ON_SubDComponentPtr *this_local;
  
  uVar1 = (uint)this->m_ptr & 6;
  if (((uVar1 == 2) || (uVar1 == 4)) || (uVar1 == 6)) {
    this_local = (ON_SubDComponentPtr *)(this->m_ptr & 0xfffffffffffffff8);
  }
  else {
    this_local = (ON_SubDComponentPtr *)0x0;
  }
  return (ON_SubDComponentBase *)this_local;
}

Assistant:

class ON_SubDComponentBase* ON_SubDComponentPtr::ComponentBase() const
{
  switch ((ON_SUBD_COMPONENT_TYPE_MASK & m_ptr))
  {
  case ON_SUBD_COMPONENT_TYPE_VERTEX:
  case ON_SUBD_COMPONENT_TYPE_EDGE:
  case ON_SUBD_COMPONENT_TYPE_FACE:
    // During archive id mapping, the returned value can be an archive id and not a true pointer.
    // This is in a controlled setting inside functions like ON_SubDArchiveIdMap::ConvertArchiveIdToRuntimeSymmetrySetNextPtr().
    // All public level SDK code can safely assume the returned value is a true pointer.
    // It does mean that you cannot "validate" the value returned here
    // using some constraint on what you feel is a reasonable true pointer value.
    return ((class ON_SubDComponentBase*)ON_SUBD_COMPONENT_POINTER(m_ptr));
    break;
  }
  return nullptr;
}